

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

int HistoryItemScored(pyhanabi_history_item_t *item)

{
  long *in_RDI;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("item != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0xeb,"int HistoryItemScored(pyhanabi_history_item_t *)");
  }
  if (*in_RDI != 0) {
    return (int)(*(byte *)(*in_RDI + 9) & 1);
  }
  __assert_fail("item->item != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0xec,"int HistoryItemScored(pyhanabi_history_item_t *)");
}

Assistant:

int HistoryItemScored(pyhanabi_history_item_t* item) {
  REQUIRE(item != nullptr);
  REQUIRE(item->item != nullptr);
  return reinterpret_cast<const hanabi_learning_env::HanabiHistoryItem*>(
             item->item)
      ->scored;
}